

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O2

TapScriptInfoStruct *
cfd::js::api::ElementsAddressStructApi::GetTapScriptTreeFromString
          (TapScriptInfoStruct *__return_storage_ptr__,TapScriptFromStringRequestStruct *request)

{
  string *in_R8;
  allocator local_239;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&)>
  local_210;
  TapScriptInfoStruct local_1f0;
  
  TapScriptInfoStruct::TapScriptInfoStruct(__return_storage_ptr__);
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  local_220 = std::
              _Function_handler<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:326:20)>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:326:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_210,"GetTapScriptTreeFromString",&local_239);
  ExecuteStructApi<cfd::js::api::TapScriptFromStringRequestStruct,cfd::js::api::TapScriptInfoStruct>
            (&local_1f0,(api *)request,(TapScriptFromStringRequestStruct *)&local_238,&local_210,
             in_R8);
  TapScriptInfoStruct::operator=(__return_storage_ptr__,&local_1f0);
  TapScriptInfoStruct::~TapScriptInfoStruct(&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::_Function_base::~_Function_base((_Function_base *)&local_238);
  return __return_storage_ptr__;
}

Assistant:

TapScriptInfoStruct ElementsAddressStructApi::GetTapScriptTreeFromString(
    const TapScriptFromStringRequestStruct& request) {
  auto call_func = [](const TapScriptFromStringRequestStruct& request)
      -> TapScriptInfoStruct {  // NOLINT
    ElementsNetType net_type = ConvertElementsNetType(request.network);
    ElementsAddressFactory api(net_type);
    return AddressApiBase::GetTapScriptTreeFromString(request, &api);
  };

  TapScriptInfoStruct result;
  result =
      ExecuteStructApi<TapScriptFromStringRequestStruct, TapScriptInfoStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}